

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudDecoder::DecodePointAttributes(PointCloudDecoder *this)

{
  pointer puVar1;
  AttributesDecoderInterface *pAVar2;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ulong in_RAX;
  ulong uVar8;
  pointer piVar9;
  int i;
  uint uVar10;
  int i_2;
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  *att_dec;
  pointer puVar11;
  ulong uVar12;
  int iVar13;
  uint8_t num_attributes_decoders;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  bVar4 = DecoderBuffer::Decode<unsigned_char>(this->buffer_,(uchar *)((long)&uStack_38 + 7));
  uVar10 = 0;
  if (!bVar4) goto LAB_0013a92f;
  do {
    if (uStack_38._7_1_ <= uVar10) {
      puVar11 = (this->attributes_decoders_).
                super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->attributes_decoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0013a84f;
    }
    iVar6 = (*this->_vptr_PointCloudDecoder[4])(this,(ulong)uVar10);
    uVar10 = uVar10 + 1;
  } while ((char)iVar6 != '\0');
  goto LAB_0013a92d;
LAB_0013a874:
  uVar8 = uStack_38 >> 0x38;
  if (uVar12 < uVar8) goto code_r0x0013a87e;
  for (uVar12 = 0; uVar12 < uVar8; uVar12 = uVar12 + 1) {
    iVar6 = (**(code **)(*(long *)(this->attributes_decoders_).
                                  super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_t.
                                  super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                                  ._M_t + 0x30))();
    iVar13 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; iVar6 != iVar13; iVar13 = iVar13 + 1) {
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
      .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
           (this->attributes_decoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_t.
           super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
           ._M_t;
      iVar7 = (**(code **)(*(long *)_Var3._M_t.
                                    super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                    .
                                    super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                    ._M_head_impl + 0x28))
                        (_Var3._M_t.
                         super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                         .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                         _M_head_impl,iVar13);
      piVar9 = (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->attribute_to_decoder_map_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar9 >> 2) <= (ulong)(long)iVar7
         ) {
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->attribute_to_decoder_map_,(long)(iVar7 + 1));
        piVar9 = (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      piVar9[iVar7] = (int)uVar12;
    }
    uVar8 = uStack_38 >> 0x38;
  }
  iVar6 = (*this->_vptr_PointCloudDecoder[7])(this);
  if ((char)iVar6 != '\0') {
    uVar10 = (*this->_vptr_PointCloudDecoder[8])(this);
    goto LAB_0013a92f;
  }
  goto LAB_0013a92d;
code_r0x0013a87e:
  _Var3._M_t.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (this->attributes_decoders_).
       super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_t.
       super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
       ._M_t;
  cVar5 = (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                                _M_head_impl + 0x18))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                     .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl
                     ,this->buffer_);
  uVar12 = uVar12 + 1;
  if (cVar5 == '\0') goto LAB_0013a92d;
  goto LAB_0013a874;
  while( true ) {
    pAVar2 = (puVar11->_M_t).
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
    iVar6 = (*pAVar2->_vptr_AttributesDecoderInterface[2])(pAVar2,this,this->point_cloud_);
    puVar11 = puVar11 + 1;
    if ((char)iVar6 == '\0') break;
LAB_0013a84f:
    if (puVar11 == puVar1) {
      uVar12 = 0;
      goto LAB_0013a874;
    }
  }
LAB_0013a92d:
  uVar10 = 0;
LAB_0013a92f:
  return SUB41(uVar10,0);
}

Assistant:

bool PointCloudDecoder::DecodePointAttributes() {
  uint8_t num_attributes_decoders;
  if (!buffer_->Decode(&num_attributes_decoders)) {
    return false;
  }
  // Create all attribute decoders. This is implementation specific and the
  // derived classes can use any data encoded in the
  // PointCloudEncoder::EncodeAttributesEncoderIdentifier() call.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!CreateAttributesDecoder(i)) {
      return false;
    }
  }

  // Initialize all attributes decoders. No data is decoded here.
  for (auto &att_dec : attributes_decoders_) {
    if (!att_dec->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Decode any data needed by the attribute decoders.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!attributes_decoders_[i]->DecodeAttributesDecoderData(buffer_)) {
      return false;
    }
  }

  // Create map between attribute and decoder ids.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    const int32_t num_attributes = attributes_decoders_[i]->GetNumAttributes();
    for (int j = 0; j < num_attributes; ++j) {
      int att_id = attributes_decoders_[i]->GetAttributeId(j);
      if (att_id >= attribute_to_decoder_map_.size()) {
        attribute_to_decoder_map_.resize(att_id + 1);
      }
      attribute_to_decoder_map_[att_id] = i;
    }
  }

  // Decode the actual attributes using the created attribute decoders.
  if (!DecodeAllAttributes()) {
    return false;
  }

  if (!OnAttributesDecoded()) {
    return false;
  }
  return true;
}